

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CommissionerApp::EnableJoiner
          (Error *__return_storage_ptr__,CommissionerApp *this,JoinerType aType,uint64_t aEui64,
          string *aPSKd,string *aProvisioningUrl)

{
  char cVar1;
  ErrorCode EVar2;
  element_type *peVar3;
  string *aProvisioningUrl_00;
  int iVar4;
  size_type sVar5;
  char *pcVar6;
  Error *pEVar7;
  char *pcVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar9;
  string_view fmt;
  format_args args;
  format_args args_00;
  undefined1 local_158 [8];
  undefined1 local_150 [24];
  undefined1 local_138 [16];
  code *local_128;
  _Rb_tree<ot::commissioner::CommissionerApp::JoinerKey,std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>,std::_Select1st<std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>>,std::less<ot::commissioner::CommissionerApp::JoinerKey>,std::allocator<std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>>>
  *local_108;
  string *local_100;
  ByteArray *local_f8;
  string local_f0;
  ByteArray joinerId;
  writer write;
  undefined1 local_b0 [8];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  CommissionerDataset local_88;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  aVar9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
           )aProvisioningUrl;
  Commissioner::ComputeJoinerId(&joinerId,aEui64);
  CommissionerDataset::CommissionerDataset(&local_88,&this->mCommDataset);
  local_88.mPresentFlags._1_1_ = local_88.mPresentFlags._1_1_ & 0x3f;
  local_f8 = GetSteeringData(&local_88,aType);
  if (aType == kMeshCoP) {
    ValidatePSKd((Error *)local_158,aPSKd);
    pEVar7 = Error::operator=(__return_storage_ptr__,(Error *)local_158);
    EVar2 = pEVar7->mCode;
    std::__cxx11::string::~string((string *)local_150);
    if (EVar2 != kNone) goto LAB_00148459;
  }
  iVar4 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])(this);
  if ((char)iVar4 == '\0') {
    local_158 = (undefined1  [8])((ulong)(uint)local_158._4_4_ << 0x20);
    local_150._0_8_ = "the commissioner is not active";
    local_150._8_8_ = (pointer)0x1e;
    local_150._16_8_ = (pointer)0x0;
    local_138._8_8_ = (parse_func)0x0;
    pcVar6 = "the commissioner is not active";
    local_138._0_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_158;
    while (pcVar8 = pcVar6, pcVar8 != "") {
      pcVar6 = pcVar8 + 1;
      if (*pcVar8 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar8 + 2;
      }
      else if (*pcVar8 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar8,"",(format_string_checker<char> *)local_158);
      }
    }
    args.field_1.args_ = aVar9.args_;
    args.desc_ = (unsigned_long_long)local_158;
    ::fmt::v10::vformat_abi_cxx11_(&local_f0,(v10 *)0x1f85d8,(string_view)ZEXT816(0x1e),args);
    local_b0._0_4_ = 0xf;
    std::__cxx11::string::string((string *)&local_a8,(string *)&local_f0);
  }
  else {
    local_158._0_4_ = aType;
    local_100 = aProvisioningUrl;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_150,&joinerId);
    local_108 = (_Rb_tree<ot::commissioner::CommissionerApp::JoinerKey,std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>,std::_Select1st<std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>>,std::less<ot::commissioner::CommissionerApp::JoinerKey>,std::allocator<std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>>>
                 *)&this->mJoiners;
    sVar5 = std::
            map<ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
            ::count((map<ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
                     *)local_108,(key_type *)local_158);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_150);
    if (sVar5 == 0) {
      Commissioner::AddJoiner(local_f8,&joinerId);
      aProvisioningUrl_00 = local_100;
      peVar3 = (this->mCommissioner).
               super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      (*peVar3->_vptr_Commissioner[0x14])(local_158,peVar3,&local_88);
      pEVar7 = Error::operator=(__return_storage_ptr__,(Error *)local_158);
      EVar2 = pEVar7->mCode;
      std::__cxx11::string::~string((string *)local_150);
      if (EVar2 == kNone) {
        MergeDataset(&this->mCommDataset,&local_88);
        local_b0._0_4_ = aType;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,&joinerId);
        JoinerInfo::JoinerInfo((JoinerInfo *)local_158,aType,aEui64,aPSKd,aProvisioningUrl_00);
        std::
        _Rb_tree<ot::commissioner::CommissionerApp::JoinerKey,std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>,std::_Select1st<std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>>,std::less<ot::commissioner::CommissionerApp::JoinerKey>,std::allocator<std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>>>
        ::
        _M_emplace_unique<ot::commissioner::CommissionerApp::JoinerKey,ot::commissioner::JoinerInfo>
                  (local_108,(JoinerKey *)local_b0,(JoinerInfo *)local_158);
        JoinerInfo::~JoinerInfo((JoinerInfo *)local_158);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
      }
      goto LAB_00148459;
    }
    local_158._0_4_ = int_type;
    local_158._4_4_ = ulong_long_type;
    local_150._0_8_ = "joiner(type={}, EUI64={:X}) has already been enabled";
    local_150._8_8_ = (pointer)0x34;
    local_150._16_8_ = (pointer)0x200000000;
    local_138._8_8_ =
         ::fmt::v10::detail::parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>;
    local_128 = ::fmt::v10::detail::
                parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
    pcVar6 = "joiner(type={}, EUI64={:X}) has already been enabled";
    local_138._0_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_158;
    write.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_158;
    while (pcVar6 != "") {
      cVar1 = *pcVar6;
      pcVar8 = pcVar6;
      while (cVar1 != '{') {
        pcVar8 = pcVar8 + 1;
        if (pcVar8 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_int,_unsigned_long>_>
          ::writer::operator()(&write,pcVar6,"");
          goto LAB_001483f1;
        }
        cVar1 = *pcVar8;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_int,_unsigned_long>_>
      ::writer::operator()(&write,pcVar6,pcVar8);
      pcVar6 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,int,unsigned_long>&>
                         (pcVar8,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_158);
    }
LAB_001483f1:
    local_158._4_4_ = none_type;
    local_158._0_4_ = aType;
    fmt.size_ = 0x41;
    fmt.data_ = (char *)0x34;
    args_00.field_1.args_ = aVar9.args_;
    args_00.desc_ = (unsigned_long_long)local_158;
    local_150._8_8_ = aEui64;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_f0,(v10 *)"joiner(type={}, EUI64={:X}) has already been enabled",fmt,args_00);
    local_b0._0_4_ = 0xd;
    std::__cxx11::string::string((string *)&local_a8,(string *)&local_f0);
  }
  Error::operator=(__return_storage_ptr__,(Error *)local_b0);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_f0);
LAB_00148459:
  CommissionerDataset::~CommissionerDataset(&local_88);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&joinerId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::EnableJoiner(JoinerType         aType,
                                    uint64_t           aEui64,
                                    const std::string &aPSKd,
                                    const std::string &aProvisioningUrl)
{
    Error error;
    auto  joinerId    = Commissioner::ComputeJoinerId(aEui64);
    auto  commDataset = mCommDataset;
    commDataset.mPresentFlags &= ~CommissionerDataset::kSessionIdBit;
    commDataset.mPresentFlags &= ~CommissionerDataset::kBorderAgentLocatorBit;
    auto &steeringData = GetSteeringData(commDataset, aType);

    if (aType == JoinerType::kMeshCoP)
    {
        SuccessOrExit(error = ValidatePSKd(aPSKd));
    }

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    VerifyOrExit(mJoiners.count({aType, joinerId}) == 0,
                 error = ERROR_ALREADY_EXISTS("joiner(type={}, EUI64={:X}) has already been enabled",
                                              utils::to_underlying(aType), aEui64));

    Commissioner::AddJoiner(steeringData, joinerId);
    SuccessOrExit(error = mCommissioner->SetCommissionerDataset(commDataset));

    MergeDataset(mCommDataset, commDataset);
    mJoiners.emplace(JoinerKey{aType, joinerId}, JoinerInfo{aType, aEui64, aPSKd, aProvisioningUrl});

exit:
    return error;
}